

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_format.cc
# Opt level: O2

size_t absl::lts_20240722::log_internal::FormatLogPrefix
                 (LogSeverity severity,Time timestamp,Tid tid,string_view basename,int line,
                 PrefixFormat format,Span<char> *buf)

{
  pointer pcVar1;
  Nonnull<char_*> output;
  int iVar2;
  uint uVar3;
  long lVar4;
  char *pcVar5;
  undefined1 *puVar6;
  size_t sVar7;
  undefined2 *puVar8;
  Span<char> *dst;
  undefined4 in_register_0000000c;
  int extraout_EDX;
  char *pcVar9;
  size_type n;
  Time TVar10;
  string_view src;
  string_view src_00;
  Tid local_6c;
  int local_68;
  int local_64;
  CivilInfo ci;
  
  dst = (Span<char> *)CONCAT44(in_register_0000000c,tid);
  if (buf->len_ < 0x22) {
    Span<char>::remove_suffix(buf,buf->len_);
    puVar6 = (undefined1 *)0x0;
    goto LAB_00102516;
  }
  lVar4 = absl::lts_20240722::log_internal::TimeZone();
  if (lVar4 == 0) {
    iVar2 = absl::lts_20240722::ToTimeval(timestamp);
    output = buf->ptr_;
    sVar7 = buf->len_;
    ci.cs.f_.y = (int_least64_t)anon_var_dwarf_d7;
    ci.cs.f_.m = '\x1b';
    ci.cs.f_.d = '\0';
    ci.cs.f_.hh = '\0';
    ci.cs.f_.mm = '\0';
    ci.cs.f_.ss = '\0';
    ci.cs.f_._13_3_ = 0;
    dst = (Span<char> *)LogSeverityName(severity);
    local_6c = tid;
    local_68 = extraout_EDX;
    local_64 = iVar2;
    uVar3 = SNPrintF<char,_int,_int,_int>
                      (output,sVar7,(FormatSpec<char,_int,_int,_int> *)&ci,(char *)dst,&local_64,
                       &local_68,&local_6c);
    if ((int)uVar3 < 0) {
      puVar6 = (undefined1 *)0x0;
    }
    else {
      puVar6 = (undefined1 *)(ulong)uVar3;
      Span<char>::remove_prefix(buf,(size_type)puVar6);
    }
    goto LAB_00102516;
  }
  pcVar9 = buf->ptr_;
  pcVar5 = LogSeverityName(severity);
  *pcVar9 = *pcVar5;
  TVar10.rep_.rep_lo_ = (uint32_t)lVar4;
  TVar10.rep_.rep_hi_ = (HiRep)&ci;
  absl::lts_20240722::TimeZone::At(TVar10);
  absl::lts_20240722::numbers_internal::PutTwoDigits((int)ci.cs.f_.m,pcVar9 + 1);
  absl::lts_20240722::numbers_internal::PutTwoDigits((int)ci.cs.f_.d,pcVar9 + 3);
  pcVar9[5] = ' ';
  absl::lts_20240722::numbers_internal::PutTwoDigits((int)ci.cs.f_.hh,pcVar9 + 6);
  pcVar9[8] = ':';
  absl::lts_20240722::numbers_internal::PutTwoDigits((int)ci.cs.f_.mm,pcVar9 + 9);
  pcVar9[0xb] = ':';
  absl::lts_20240722::numbers_internal::PutTwoDigits((int)ci.cs.f_.ss,pcVar9 + 0xc);
  pcVar9[0xe] = '.';
  lVar4 = absl::lts_20240722::ToInt64Microseconds(ci.subsecond);
  absl::lts_20240722::numbers_internal::PutTwoDigits((uint)(lVar4 / 10000),pcVar9 + 0xf);
  dst = (Span<char> *)0x64;
  absl::lts_20240722::numbers_internal::PutTwoDigits((uint)((lVar4 / 100) % 100),pcVar9 + 0x11);
  absl::lts_20240722::numbers_internal::PutTwoDigits((uint)(lVar4 % 100),pcVar9 + 0x13);
  pcVar9[0x15] = ' ';
  if ((uint)tid < 10) {
    pcVar9[0x16] = ' ';
    pcVar9 = pcVar9 + 0x17;
LAB_001024c3:
    *pcVar9 = ' ';
    pcVar9 = pcVar9 + 1;
LAB_001024cb:
    *pcVar9 = ' ';
    pcVar9 = pcVar9 + 1;
LAB_001024d3:
    *pcVar9 = ' ';
    pcVar9 = pcVar9 + 1;
LAB_001024db:
    *pcVar9 = ' ';
    pcVar9 = pcVar9 + 1;
LAB_001024e3:
    *pcVar9 = ' ';
    pcVar9 = pcVar9 + 1;
  }
  else {
    pcVar9 = pcVar9 + 0x16;
    if (tid + 9U < 0x6d) goto LAB_001024c3;
    if (tid + 99U < 1099) goto LAB_001024cb;
    if (tid + 999U < 10999) goto LAB_001024d3;
    if (tid + 9999U < 109999) goto LAB_001024db;
    if (tid + 99999U < 1099999) goto LAB_001024e3;
  }
  puVar6 = (undefined1 *)absl::lts_20240722::numbers_internal::FastIntToBuffer(tid,pcVar9);
  *puVar6 = 0x20;
  puVar6 = puVar6 + (1 - (long)buf->ptr_);
  Span<char>::remove_prefix(buf,(size_type)puVar6);
LAB_00102516:
  src._M_str = (char *)buf;
  src._M_len = (size_t)basename._M_str;
  sVar7 = AppendTruncated((log_internal *)basename._M_len,src,dst);
  if (buf->len_ < 0xe) {
    Span<char>::remove_suffix(buf,buf->len_);
    n = 0;
  }
  else {
    pcVar1 = buf->ptr_;
    *pcVar1 = ':';
    puVar8 = (undefined2 *)absl::lts_20240722::numbers_internal::FastIntToBuffer(line,pcVar1 + 1);
    *puVar8 = 0x205d;
    n = (long)puVar8 + (2 - (long)buf->ptr_);
    Span<char>::remove_prefix(buf,n);
  }
  puVar6 = puVar6 + n + sVar7;
  if (format == kRaw) {
    src_00._M_str = (char *)buf;
    src_00._M_len = (size_t)"RAW: ";
    sVar7 = AppendTruncated((log_internal *)0x5,src_00,dst);
    puVar6 = puVar6 + sVar7;
  }
  return (size_t)puVar6;
}

Assistant:

size_t FormatLogPrefix(absl::LogSeverity severity, absl::Time timestamp,
                       log_internal::Tid tid, absl::string_view basename,
                       int line, PrefixFormat format, absl::Span<char>& buf) {
  auto prefix_size = FormatBoundedFields(severity, timestamp, tid, buf);
  prefix_size += log_internal::AppendTruncated(basename, buf);
  prefix_size += FormatLineNumber(line, buf);
  if (format == PrefixFormat::kRaw)
    prefix_size += log_internal::AppendTruncated("RAW: ", buf);
  return prefix_size;
}